

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonKey
               (ostream *stream,string *element_name,string *name,string *value,string *indent,
               bool comma)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  string *in_RDX;
  string *in_RSI;
  ostream *in_RDI;
  string *in_R8;
  byte in_R9B;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *allowed_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffee8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff00;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  GTestLogSeverity in_stack_ffffffffffffff6c;
  GTestLog *in_stack_ffffffffffffff70;
  GTestLog local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  undefined1 local_50 [24];
  undefined1 *local_38;
  byte local_29;
  string *local_28;
  string *local_18;
  string *local_10;
  ostream *local_8;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  GetReservedOutputAttributesForElement(in_stack_ffffffffffffff28);
  local_38 = local_50;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(in_stack_fffffffffffffee8);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(in_stack_fffffffffffffee8);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                        in_stack_fffffffffffffef8);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(in_stack_fffffffffffffee8);
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_fffffffffffffef0,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffee8);
  bVar1 = IsTrue(bVar1);
  if (!bVar1) {
    GTestLog::GTestLog(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60
                       ,in_stack_ffffffffffffff5c);
    poVar2 = GTestLog::GetStream(&local_84);
    poVar2 = std::operator<<(poVar2,
                             "Condition std::find(allowed_names.begin(), allowed_names.end(), name) != allowed_names.end() failed. "
                            );
    poVar2 = std::operator<<(poVar2,"Key \"");
    poVar2 = std::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2,"\" is not allowed for value \"");
    poVar2 = std::operator<<(poVar2,local_10);
    std::operator<<(poVar2,"\".");
    GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffef0);
  }
  poVar2 = std::operator<<(local_8,local_28);
  poVar2 = std::operator<<(poVar2,"\"");
  poVar3 = std::operator<<(poVar2,local_18);
  poVar3 = std::operator<<(poVar3,"\": \"");
  EscapeJson((string *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  poVar3 = std::operator<<(poVar3,(string *)&stack0xffffffffffffff58);
  std::operator<<(poVar3,"\"");
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  if ((local_29 & 1) != 0) {
    std::operator<<(local_8,",\n");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)poVar2);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonKey(
    std::ostream* stream,
    const std::string& element_name,
    const std::string& name,
    const std::string& value,
    const std::string& indent,
    bool comma) {
  const std::vector<std::string>& allowed_names =
      GetReservedOutputAttributesForElement(element_name);

  GTEST_CHECK_(std::find(allowed_names.begin(), allowed_names.end(), name) !=
                   allowed_names.end())
      << "Key \"" << name << "\" is not allowed for value \"" << element_name
      << "\".";

  *stream << indent << "\"" << name << "\": \"" << EscapeJson(value) << "\"";
  if (comma)
    *stream << ",\n";
}